

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_monte_carlo.cpp
# Opt level: O0

double triangle01_monomial_integral(int *e)

{
  int local_28;
  int m;
  int k;
  int j;
  double integral;
  int i;
  int *e_local;
  
  integral._4_4_ = 0;
  while( true ) {
    if (1 < integral._4_4_) {
      local_28 = 0;
      _k = 1.0;
      for (integral._4_4_ = 0; integral._4_4_ < 2; integral._4_4_ = integral._4_4_ + 1) {
        for (m = 1; m <= e[integral._4_4_]; m = m + 1) {
          local_28 = local_28 + 1;
          _k = (_k * (double)m) / (double)local_28;
        }
      }
      for (integral._4_4_ = 0; integral._4_4_ < 2; integral._4_4_ = integral._4_4_ + 1) {
        local_28 = local_28 + 1;
        _k = _k / (double)local_28;
      }
      return _k;
    }
    if (e[integral._4_4_] < 0) break;
    integral._4_4_ = integral._4_4_ + 1;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"TRIANGLE01_MONOMIAL_INTEGRAL - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  All exponents must be nonnegative.\n");
  exit(1);
}

Assistant:

double triangle01_monomial_integral ( int e[] )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE01_MONOMIAL_INTEGRAL: monomial integrals in the unit triangle in 2D.
//
//  Discussion:
//
//    The monomial is F(X,Y) = X^E(1) * Y^E(2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int E[2], the exponents.  
//    Each exponent must be nonnegative.
//
//    Output, double TRIANGLE01_MONOMIAL_INTEGRAL, the integral.
//
{
  int i;
  double integral;
  int j;
  int k;
  const int m = 2;

  for ( i = 0; i < m; i++ )
  {
    if ( e[i] < 0 )
    {
      std::cerr << "\n";
      std::cerr << "TRIANGLE01_MONOMIAL_INTEGRAL - Fatal error!\n";
      std::cerr << "  All exponents must be nonnegative.\n";
      exit ( 1 );
    }
  }

  k = 0;
  integral = 1.0;

  for ( i = 0; i < m; i++ )
  {
    for ( j = 1; j <= e[i]; j++ )
    {
      k = k + 1;
      integral = integral * double( j ) / double( k );
    }
  }

  for ( i = 0; i < m; i++ )
  {
    k = k + 1;
    integral = integral / double( k );
  }

  return integral;
}